

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::printAperture(Station *this,int aperture)

{
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  void *pvVar4;
  reference pvVar5;
  reference pvVar6;
  int in_ESI;
  long in_RDI;
  int i;
  int local_10;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Station: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 8));
  poVar2 = std::operator<<(poVar2," aperture: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
  poVar2 = std::operator<<(poVar2," intensity ");
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)in_ESI);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,*pvVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_10 = 0;
  while( true ) {
    iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0));
    if (iVar1 <= local_10) break;
    pvVar5 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)(in_RDI + 0x58),(long)in_ESI);
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar5,(long)local_10);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,pvVar6->first);
    poVar2 = std::operator<<(poVar2,"-");
    pvVar5 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)(in_RDI + 0x58),(long)in_ESI);
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar5,(long)local_10);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,pvVar6->second);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void Station::printAperture(int aperture) {
    cout << "Station: "<< angle << " aperture: " << aperture << " intensity "<< intensity[aperture]<< endl;
    for (int i=0; i<collimator.getXdim(); i++) {
      cout << A[aperture][i].first << "-" << A[aperture][i].second << endl;
    }
  }